

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_GLOB *data;
  REF_INT *data_00;
  REF_DBL *data_01;
  REF_GLOB local_e8;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *edge_aux;
  REF_DBL *edge_real;
  REF_INT *edge_part;
  REF_GLOB *edge_global;
  long lStack_58;
  REF_INT part;
  REF_GLOB global;
  REF_CELL_TYPE local_48;
  REF_INT i;
  REF_INT node;
  REF_INT edge;
  REF_GEOM ref_geom;
  REF_MPI ref_mpi;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_GRID_conflict ref_grid;
  REF_SUBDIV ref_subdiv_local;
  
  ref_node = (REF_NODE)ref_subdiv->grid;
  ref_edge = (REF_EDGE)ref_subdiv->grid->node;
  ref_mpi = (REF_MPI)ref_subdiv->edge;
  ref_geom = (REF_GEOM)ref_subdiv->grid->mpi;
  _node = ((REF_GRID_conflict)ref_node)->geom;
  ref_grid = (REF_GRID_conflict)ref_subdiv;
  for (i = 0; i < ref_mpi->n; i = i + 1) {
    if (((&ref_grid->cell[0]->type)[i] == REF_CELL_EDG) &&
       ((&ref_grid->cell[1]->type)[i] != ~REF_CELL_EDG)) {
      local_48 = (&ref_grid->cell[1]->type)[i];
      uVar1 = ref_geom_remove_all(_node,local_48);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x390,"ref_subdiv_new_node",(ulong)uVar1,"remove geom from node");
        return uVar1;
      }
      uVar1 = ref_edge_part((REF_EDGE)ref_mpi,i,(REF_INT *)((long)&edge_global + 4));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x391,"ref_subdiv_new_node",(ulong)uVar1,"edge part");
        return uVar1;
      }
      if (ref_geom->max == edge_global._4_4_) {
        uVar1 = ref_node_remove((REF_NODE)ref_edge,local_48);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x393,"ref_subdiv_new_node",(ulong)uVar1,"owned, rm node with global");
          return uVar1;
        }
      }
      else {
        uVar1 = ref_node_remove_without_global((REF_NODE)ref_edge,local_48);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x396,"ref_subdiv_new_node",(ulong)uVar1,"ghost, rm node without global");
          return uVar1;
        }
      }
      (&ref_grid->cell[1]->type)[i] = ~REF_CELL_EDG;
    }
  }
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_edge);
  if (uVar1 == 0) {
    for (i = 0; i < ref_mpi->n; i = i + 1) {
      if (((&ref_grid->cell[0]->type)[i] != REF_CELL_EDG) &&
         ((&ref_grid->cell[1]->type)[i] == ~REF_CELL_EDG)) {
        uVar1 = ref_edge_part((REF_EDGE)ref_mpi,i,(REF_INT *)((long)&edge_global + 4));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x3a1,"ref_subdiv_new_node",(ulong)uVar1,"edge part");
          return uVar1;
        }
        if (ref_geom->max == edge_global._4_4_) {
          uVar1 = ref_node_next_global((REF_NODE)ref_edge,&stack0xffffffffffffffa8);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a3,"ref_subdiv_new_node",(ulong)uVar1,"next global");
            return uVar1;
          }
          uVar1 = ref_node_add((REF_NODE)ref_edge,lStack_58,(REF_INT *)&local_48);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a4,"ref_subdiv_new_node",(ulong)uVar1,"add node");
            return uVar1;
          }
          (&ref_grid->cell[1]->type)[i] = local_48;
          uVar1 = ref_node_interpolate_edge
                            ((REF_NODE)ref_edge,
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i << 1) * 4),
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i * 2 + 1) * 4),0.5,
                             local_48);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a9,"ref_subdiv_new_node",(ulong)uVar1,"new node");
            return uVar1;
          }
          uVar1 = ref_geom_add_between
                            ((REF_GRID)ref_node,
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i << 1) * 4),
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i * 2 + 1) * 4),0.5,
                             local_48);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3ac,"ref_subdiv_new_node",(ulong)uVar1,"new node");
            return uVar1;
          }
          uVar1 = ref_geom_constrain((REF_GRID)ref_node,local_48);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3ad,"ref_subdiv_new_node",(ulong)uVar1,"geom constraint");
            return uVar1;
          }
          uVar1 = ref_metric_interpolate_between
                            ((REF_GRID)ref_node,
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i << 1) * 4),
                             *(REF_INT *)(*(long *)&ref_mpi->max_tag + (long)(i * 2 + 1) * 4),
                             local_48);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3b1,"ref_subdiv_new_node",(ulong)uVar1,"interp new metric");
            return uVar1;
          }
        }
      }
    }
    uVar1 = ref_node_shift_new_globals((REF_NODE)ref_edge);
    if (uVar1 == 0) {
      if (ref_mpi->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x3b8,"ref_subdiv_new_node","malloc edge_global of REF_GLOB negative");
        ref_subdiv_local._4_4_ = 1;
      }
      else {
        data = (REF_GLOB *)malloc((long)ref_mpi->n << 3);
        if (data == (REF_GLOB *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x3b8,"ref_subdiv_new_node","malloc edge_global of REF_GLOB NULL");
          ref_subdiv_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < ref_mpi->n;
              ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
            data[ref_malloc_init_i_2] = -1;
          }
          if (ref_mpi->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3b9,"ref_subdiv_new_node","malloc edge_part of REF_INT negative");
            ref_subdiv_local._4_4_ = 1;
          }
          else {
            data_00 = (REF_INT *)malloc((long)ref_mpi->n << 2);
            if (data_00 == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x3b9,"ref_subdiv_new_node","malloc edge_part of REF_INT NULL");
              ref_subdiv_local._4_4_ = 2;
            }
            else {
              for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < ref_mpi->n;
                  ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
                data_00[ref_malloc_init_i_3] = -1;
              }
              if (ref_mpi->n * 0xf < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x3bb,"ref_subdiv_new_node","malloc edge_real of REF_DBL negative");
                ref_subdiv_local._4_4_ = 1;
              }
              else {
                data_01 = (REF_DBL *)malloc((long)(ref_mpi->n * 0xf) << 3);
                if (data_01 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x3bb,"ref_subdiv_new_node","malloc edge_real of REF_DBL NULL");
                  ref_subdiv_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_13 = 0;
                      SBORROW4(ref_private_macro_code_rss_13,ref_mpi->n * 0xf) !=
                      ref_private_macro_code_rss_13 + ref_mpi->n * -0xf < 0;
                      ref_private_macro_code_rss_13 = ref_private_macro_code_rss_13 + 1) {
                    data_01[ref_private_macro_code_rss_13] = -999.0;
                  }
                  _ref_private_macro_code_rss_1 = (REF_DBL *)0x0;
                  if (0 < ref_edge[2].n) {
                    if (ref_edge[2].n * ref_mpi->n < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x3bf,"ref_subdiv_new_node","malloc edge_aux of REF_DBL negative");
                      return 1;
                    }
                    _ref_private_macro_code_rss_1 =
                         (REF_DBL *)malloc((long)(ref_edge[2].n * ref_mpi->n) << 3);
                    if (_ref_private_macro_code_rss_1 == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x3bf,"ref_subdiv_new_node","malloc edge_aux of REF_DBL NULL");
                      return 2;
                    }
                    for (ref_private_macro_code_rss_14 = 0;
                        ref_private_macro_code_rss_14 < ref_edge[2].n * ref_mpi->n;
                        ref_private_macro_code_rss_14 = ref_private_macro_code_rss_14 + 1) {
                      _ref_private_macro_code_rss_1[ref_private_macro_code_rss_14] = 0.0;
                    }
                  }
                  for (i = 0; i < ref_mpi->n; i = i + 1) {
                    local_48 = (&ref_grid->cell[1]->type)[i];
                    if (local_48 != ~REF_CELL_EDG) {
                      uVar1 = ref_edge_part((REF_EDGE)ref_mpi,i,(REF_INT *)((long)&edge_global + 4))
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x3c4,"ref_subdiv_new_node",(ulong)uVar1,"edge part");
                        return uVar1;
                      }
                      if (ref_geom->max == edge_global._4_4_) {
                        if ((((int)local_48 < 0) || (ref_edge->max <= (int)local_48)) ||
                           (*(long *)(&ref_edge->adj->nnode + (long)(int)local_48 * 2) < 0)) {
                          local_e8 = -1;
                        }
                        else {
                          local_e8 = *(REF_GLOB *)(&ref_edge->adj->nnode + (long)(int)local_48 * 2);
                        }
                        data[i] = local_e8;
                        data_00[i] = ref_edge[1].e2n[(int)local_48];
                        for (global._4_4_ = 0; global._4_4_ < 0xf; global._4_4_ = global._4_4_ + 1)
                        {
                          data_01[global._4_4_ + i * 0xf] =
                               *(REF_DBL *)
                                (&(ref_edge[1].node)->n +
                                (long)(int)(global._4_4_ + local_48 * 0xf) * 2);
                        }
                        for (global._4_4_ = 0; global._4_4_ < ref_edge[2].n;
                            global._4_4_ = global._4_4_ + 1) {
                          _ref_private_macro_code_rss_1[global._4_4_ + ref_edge[2].n * i] =
                               *(REF_DBL *)
                                (ref_edge[2].e2n +
                                (long)(int)(global._4_4_ + ref_edge[2].n * local_48) * 2);
                        }
                      }
                    }
                  }
                  uVar1 = ref_edge_ghost_glob((REF_EDGE)ref_mpi,(REF_MPI)ref_geom,data);
                  if (uVar1 == 0) {
                    uVar1 = ref_edge_ghost_int((REF_EDGE)ref_mpi,(REF_MPI)ref_geom,data_00);
                    if (uVar1 == 0) {
                      uVar1 = ref_edge_ghost_dbl((REF_EDGE)ref_mpi,(REF_MPI)ref_geom,data_01,0xf);
                      if (uVar1 == 0) {
                        if ((ref_edge[2].n < 1) ||
                           (uVar1 = ref_edge_ghost_dbl((REF_EDGE)ref_mpi,(REF_MPI)ref_geom,
                                                       _ref_private_macro_code_rss_1,ref_edge[2].n),
                           uVar1 == 0)) {
                          for (i = 0; i < ref_mpi->n; i = i + 1) {
                            lStack_58 = data[i];
                            if (lStack_58 != -1) {
                              uVar1 = ref_node_add((REF_NODE)ref_edge,lStack_58,(REF_INT *)&local_48
                                                  );
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                       ,0x3df,"ref_subdiv_new_node",(ulong)uVar1,"add node");
                                return uVar1;
                              }
                              (&ref_grid->cell[1]->type)[i] = local_48;
                              ref_edge[1].e2n[(int)local_48] = data_00[i];
                              for (global._4_4_ = 0; global._4_4_ < 0xf;
                                  global._4_4_ = global._4_4_ + 1) {
                                *(REF_DBL *)
                                 (&(ref_edge[1].node)->n +
                                 (long)(int)(global._4_4_ + local_48 * 0xf) * 2) =
                                     data_01[global._4_4_ + i * 0xf];
                              }
                              for (global._4_4_ = 0; global._4_4_ < ref_edge[2].n;
                                  global._4_4_ = global._4_4_ + 1) {
                                *(REF_DBL *)
                                 (ref_edge[2].e2n +
                                 (long)(int)(global._4_4_ + ref_edge[2].n * local_48) * 2) =
                                     _ref_private_macro_code_rss_1[global._4_4_ + ref_edge[2].n * i]
                                ;
                              }
                            }
                          }
                          uVar1 = ref_geom_ghost(_node,(REF_NODE)ref_edge);
                          if (uVar1 == 0) {
                            if (_ref_private_macro_code_rss_1 != (REF_DBL *)0x0) {
                              free(_ref_private_macro_code_rss_1);
                            }
                            if (data_01 != (REF_DBL *)0x0) {
                              free(data_01);
                            }
                            if (data_00 != (REF_INT *)0x0) {
                              free(data_00);
                            }
                            if (data != (REF_GLOB *)0x0) {
                              free(data);
                            }
                            ref_subdiv_local._4_4_ = 0;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x3eb,"ref_subdiv_new_node",(ulong)uVar1,"fill new node geom");
                            ref_subdiv_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x3d9,"ref_subdiv_new_node",(ulong)uVar1,"aux ghost");
                          ref_subdiv_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x3d5,"ref_subdiv_new_node",(ulong)uVar1,"xyz ghost");
                        ref_subdiv_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x3d3,"ref_subdiv_new_node",(ulong)uVar1,"part ghost");
                      ref_subdiv_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x3d2,"ref_subdiv_new_node",(ulong)uVar1,"global ghost");
                    ref_subdiv_local._4_4_ = uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x3b6,"ref_subdiv_new_node",(ulong)uVar1,"shift glob");
      ref_subdiv_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x39c,
           "ref_subdiv_new_node",(ulong)uVar1,"sync glob");
    ref_subdiv_local._4_4_ = uVar1;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_MPI ref_mpi = ref_subdiv_mpi(ref_subdiv);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT edge, node, i;
  REF_GLOB global;
  REF_INT part;

  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_DBL *edge_aux;

  /* remove previously created new_node that is unmarked */
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (!ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY != ref_subdiv_node(ref_subdiv, edge)) {
      node = ref_subdiv_node(ref_subdiv, edge);
      RSS(ref_geom_remove_all(ref_geom, node), "remove geom from node");
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_remove(ref_node, node), "owned, rm node with global");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node),
            "ghost, rm node without global");
      }
      ref_subdiv_node(ref_subdiv, edge) = REF_EMPTY;
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY == ref_subdiv_node(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &node), "add node");
        ref_subdiv_node(ref_subdiv, edge) = node;
        RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                      ref_edge_e2n(ref_edge, 1, edge), 0.5,
                                      node),
            "new node");
        RSS(ref_geom_add_between(ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                                 ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
            "new node");
        RSS(ref_geom_constrain(ref_grid, node), "geom constraint");
        RSS(ref_metric_interpolate_between(
                ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                ref_edge_e2n(ref_edge, 1, edge), node),
            "interp new metric");
      }
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);
  edge_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc_init(edge_aux, ref_node_naux(ref_node) * ref_edge_n(ref_edge),
                    REF_DBL, 0.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_subdiv_node(ref_subdiv, edge);
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_node, node);
        edge_part[edge] = ref_node_part(ref_node, node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_node, i, node);
        for (i = 0; i < ref_node_naux(ref_node); i++)
          edge_aux[i + ref_node_naux(ref_node) * edge] =
              ref_node_aux(ref_node, i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_aux,
                           ref_node_naux(ref_node)),
        "aux ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_node, global, &node), "add node");
      ref_subdiv_node(ref_subdiv, edge) = node;
      ref_node_part(ref_node, node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_node, i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) =
            edge_aux[i + ref_node_naux(ref_node) * edge];
    }
  }

  RSS(ref_geom_ghost(ref_geom, ref_node), "fill new node geom");

  ref_free(edge_aux);
  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}